

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::Statistics::printTo(Statistics *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_02;
  string sStack_38;
  
  std::operator<<(out,"Statistics(");
  std::operator<<(out,"max=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(&sStack_38,(thrift *)&this->max,t);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"min=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(&sStack_38,(thrift *)&this->min,t_00);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"null_count=");
  if (((byte)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&sStack_38,&this->null_count);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"distinct_count=");
  if (((byte)this->__isset & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&sStack_38,&this->distinct_count);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"max_value=");
  if (((byte)this->__isset & 0x10) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&sStack_38,(thrift *)&this->max_value,t_01);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"min_value=");
  if (((byte)this->__isset & 0x20) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&sStack_38,(thrift *)&this->min_value,t_02);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"is_max_value_exact=");
  if (((byte)this->__isset & 0x40) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&sStack_38,&this->is_max_value_exact);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"is_min_value_exact=");
  if ((char)this->__isset < '\0') {
    duckdb_apache::thrift::to_string<bool>(&sStack_38,&this->is_min_value_exact);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    std::operator<<(out,"<null>");
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void Statistics::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Statistics(";
  out << "max="; (__isset.max ? (out << to_string(max)) : (out << "<null>"));
  out << ", " << "min="; (__isset.min ? (out << to_string(min)) : (out << "<null>"));
  out << ", " << "null_count="; (__isset.null_count ? (out << to_string(null_count)) : (out << "<null>"));
  out << ", " << "distinct_count="; (__isset.distinct_count ? (out << to_string(distinct_count)) : (out << "<null>"));
  out << ", " << "max_value="; (__isset.max_value ? (out << to_string(max_value)) : (out << "<null>"));
  out << ", " << "min_value="; (__isset.min_value ? (out << to_string(min_value)) : (out << "<null>"));
  out << ", " << "is_max_value_exact="; (__isset.is_max_value_exact ? (out << to_string(is_max_value_exact)) : (out << "<null>"));
  out << ", " << "is_min_value_exact="; (__isset.is_min_value_exact ? (out << to_string(is_min_value_exact)) : (out << "<null>"));
  out << ")";
}